

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

snd_pcm_format_t Pa2AlsaFormat(PaSampleFormat paFormat)

{
  switch(paFormat) {
  case 1:
    return SND_PCM_FORMAT_FLOAT;
  case 2:
    return SND_PCM_FORMAT_S32;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_00110677_caseD_3;
  case 4:
    return SND_PCM_FORMAT_S24_3LE;
  case 8:
    return SND_PCM_FORMAT_S16;
  default:
    if (paFormat == 0x10) {
      return SND_PCM_FORMAT_S8;
    }
    if (paFormat == 0x20) {
      return SND_PCM_FORMAT_U8;
    }
switchD_00110677_caseD_3:
    return SND_PCM_FORMAT_UNKNOWN;
  }
}

Assistant:

static snd_pcm_format_t Pa2AlsaFormat( PaSampleFormat paFormat )
{
    switch( paFormat )
    {
        case paFloat32:
            return SND_PCM_FORMAT_FLOAT;

        case paInt16:
            return SND_PCM_FORMAT_S16;

        case paInt24:
#ifdef PA_LITTLE_ENDIAN
            return SND_PCM_FORMAT_S24_3LE;
#elif defined PA_BIG_ENDIAN
            return SND_PCM_FORMAT_S24_3BE;
#endif

        case paInt32:
            return SND_PCM_FORMAT_S32;

        case paInt8:
            return SND_PCM_FORMAT_S8;

        case paUInt8:
            return SND_PCM_FORMAT_U8;

        default:
            return SND_PCM_FORMAT_UNKNOWN;
    }
}